

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_RunLengthDecode.hh
# Opt level: O2

Pipeline * __thiscall SF_RunLengthDecode::getDecodePipeline(SF_RunLengthDecode *this,Pipeline *next)

{
  __shared_ptr<Pl_RunLength,_(__gnu_cxx::_Lock_policy)2> local_28;
  Pipeline *local_18;
  
  local_18 = next;
  std::make_shared<Pl_RunLength,char_const(&)[17],Pipeline*&,Pl_RunLength::action_e>
            ((char (*) [17])&local_28,(Pipeline **)"runlength decode",(action_e *)&local_18);
  std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&this->pipeline,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline =
            std::make_shared<Pl_RunLength>("runlength decode", next, Pl_RunLength::a_decode);
        return this->pipeline.get();
    }